

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O0

int eckey_pub_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  pointer peVar4;
  uint8_t *in;
  unique_ptr<ec_key_st,_bssl::internal::Deleter> local_38;
  UniquePtr<EC_KEY> eckey;
  EC_GROUP *group;
  CBS *key_local;
  CBS *params_local;
  EVP_PKEY *out_local;
  
  eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
       EC_KEY_parse_curve_name(params);
  if (((tuple<ec_key_st_*,_bssl::internal::Deleter>)
       eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
       (_Head_base<0UL,_ec_key_st_*,_false>)0x0) || (sVar3 = CBS_len(params), sVar3 != 0)) {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                  ,0x39);
    return 0;
  }
  peVar4 = (pointer)EC_KEY_new();
  std::unique_ptr<ec_key_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&local_38,peVar4);
  bVar1 = std::operator==(&local_38,(nullptr_t)0x0);
  if (!bVar1) {
    peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get(&local_38);
    iVar2 = EC_KEY_set_group((EC_KEY *)peVar4,
                             (EC_GROUP *)
                             eckey._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
    if (iVar2 != 0) {
      peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get(&local_38);
      in = CBS_data(key);
      sVar3 = CBS_len(key);
      iVar2 = EC_KEY_oct2key(peVar4,in,sVar3,(BN_CTX *)0x0);
      if (iVar2 != 0) {
        peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::release(&local_38);
        EVP_PKEY_assign_EC_KEY(out,peVar4);
        out_local._4_4_ = 1;
        goto LAB_00194844;
      }
    }
  }
  out_local._4_4_ = 0;
LAB_00194844:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  return out_local._4_4_;
}

Assistant:

static int eckey_pub_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 5480, section 2.

  // The parameters are a named curve.
  const EC_GROUP *group = EC_KEY_parse_curve_name(params);
  if (group == NULL || CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  bssl::UniquePtr<EC_KEY> eckey(EC_KEY_new());
  if (eckey == nullptr ||  //
      !EC_KEY_set_group(eckey.get(), group) ||
      !EC_KEY_oct2key(eckey.get(), CBS_data(key), CBS_len(key), nullptr)) {
    return 0;
  }

  EVP_PKEY_assign_EC_KEY(out, eckey.release());
  return 1;
}